

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SetCursorPosYAndSetupDummyPrevLine(float pos_y,float line_height)

{
  ImGuiWindow *pIVar1;
  float in_XMM1_Da;
  ImGuiWindow *window;
  undefined8 in_stack_fffffffffffffff0;
  
  ImGui::SetCursorPosY((float)((ulong)in_stack_fffffffffffffff0 >> 0x20));
  pIVar1 = ImGui::GetCurrentWindow();
  (pIVar1->DC).CursorPosPrevLine.y = (pIVar1->DC).CursorPos.y - in_XMM1_Da;
  (pIVar1->DC).PrevLineSize.y = in_XMM1_Da - (GImGui->Style).ItemSpacing.y;
  if ((pIVar1->DC).ColumnsSet != (ImGuiColumnsSet *)0x0) {
    ((pIVar1->DC).ColumnsSet)->LineMinY = (pIVar1->DC).CursorPos.y;
  }
  return;
}

Assistant:

static void SetCursorPosYAndSetupDummyPrevLine(float pos_y, float line_height)
{
    // Set cursor position and a few other things so that SetScrollHereY() and Columns() can work when seeking cursor.
    // FIXME: It is problematic that we have to do that here, because custom/equivalent end-user code would stumble on the same issue.
    // The clipper should probably have a 4th step to display the last item in a regular manner.
    ImGui::SetCursorPosY(pos_y);
    ImGuiWindow* window = ImGui::GetCurrentWindow();
    window->DC.CursorPosPrevLine.y = window->DC.CursorPos.y - line_height;      // Setting those fields so that SetScrollHereY() can properly function after the end of our clipper usage.
    window->DC.PrevLineSize.y = (line_height - GImGui->Style.ItemSpacing.y);    // If we end up needing more accurate data (to e.g. use SameLine) we may as well make the clipper have a fourth step to let user process and display the last item in their list.
    if (window->DC.ColumnsSet)
        window->DC.ColumnsSet->LineMinY = window->DC.CursorPos.y;           // Setting this so that cell Y position are set properly
}